

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::ScaleRatioFromValueT<double,double,double>
                (ImGuiDataType data_type,double v,double v_min,double v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  bool bVar1;
  byte in_SIL;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float result;
  double v_max_fudged;
  double v_min_fudged;
  bool flipped;
  double v_clamped;
  float local_b4;
  double local_88;
  float local_7c;
  double local_78;
  float local_6c;
  double local_68;
  float local_54;
  double local_50;
  double local_48;
  double local_20;
  double local_18;
  double local_10;
  float local_4;
  
  if ((in_XMM1_Qa != in_XMM2_Qa) || (NAN(in_XMM1_Qa) || NAN(in_XMM2_Qa))) {
    local_20 = in_XMM2_Qa;
    local_18 = in_XMM1_Qa;
    local_10 = in_XMM0_Qa;
    if (in_XMM2_Qa <= in_XMM1_Qa) {
      local_68 = ImClamp<double>(in_XMM0_Qa,in_XMM2_Qa,in_XMM1_Qa);
    }
    else {
      local_68 = ImClamp<double>(in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
    }
    if ((in_SIL & 1) == 0) {
      local_4 = (float)((local_68 - local_18) / (local_20 - local_18));
    }
    else {
      bVar1 = local_20 < local_18;
      if (bVar1) {
        ImSwap<double>(&local_18,&local_20);
      }
      dVar2 = ImAbs(local_18);
      if ((double)in_XMM3_Da <= dVar2) {
        local_78 = local_18;
      }
      else {
        local_6c = in_XMM3_Da;
        if (local_18 < 0.0) {
          local_6c = -in_XMM3_Da;
        }
        local_78 = (double)local_6c;
      }
      local_48 = local_78;
      dVar2 = ImAbs(local_20);
      if ((double)in_XMM3_Da <= dVar2) {
        local_88 = local_20;
      }
      else {
        local_7c = in_XMM3_Da;
        if (local_20 < 0.0) {
          local_7c = -in_XMM3_Da;
        }
        local_88 = (double)local_7c;
      }
      local_50 = local_88;
      if (((local_18 != 0.0) || (NAN(local_18))) || (0.0 <= local_20)) {
        if (((local_20 == 0.0) && (!NAN(local_20))) && (local_18 < 0.0)) {
          local_50 = (double)-in_XMM3_Da;
        }
      }
      else {
        local_48 = (double)-in_XMM3_Da;
      }
      if (local_48 < local_68) {
        if (local_68 < local_50) {
          if (0.0 <= local_18 * local_20) {
            if ((local_18 < 0.0) || (local_20 < 0.0)) {
              dVar2 = ImLog(1.08149784117099e-317);
              dVar3 = ImLog(1.08153390796313e-317);
              local_54 = 1.0 - (float)(dVar2 / dVar3);
            }
            else {
              dVar2 = ImLog(1.08156256377059e-317);
              dVar3 = ImLog(1.08157392728045e-317);
              local_54 = (float)(dVar2 / dVar3);
            }
          }
          else {
            local_54 = -(float)local_18 / ((float)local_20 - (float)local_18);
            if ((local_10 != 0.0) || (NAN(local_10))) {
              if (0.0 <= local_10) {
                dVar2 = ImLog(1.08140051023876e-317);
                dVar3 = ImLog(1.08141730847072e-317);
                local_54 = (float)(dVar2 / dVar3) * (1.0 - (local_54 + in_XMM4_Da)) +
                           local_54 + in_XMM4_Da;
              }
              else {
                dVar2 = ImLog(1.08132788258882e-317);
                dVar3 = ImLog(1.08135604433063e-317);
                local_54 = (1.0 - (float)(dVar2 / dVar3)) * (local_54 - in_XMM4_Da);
              }
            }
          }
        }
        else {
          local_54 = 1.0;
        }
      }
      else {
        local_54 = 0.0;
      }
      if (bVar1) {
        local_b4 = 1.0 - local_54;
      }
      else {
        local_b4 = local_54;
      }
      local_4 = local_b4;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}